

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.h
# Opt level: O1

int flvtag_addsei(flvtag_t *tag,sei_t *sei)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  byte bVar5;
  int iVar6;
  size_t sVar7;
  uint uVar8;
  long lVar9;
  uint *puVar10;
  flvtag_frametype_t type;
  flvtag_t new_tag;
  sei_t new_sei;
  flvtag_t tag3;
  flvtag_t local_78;
  flvtag_t *local_68;
  sei_t local_60;
  uint8_t *local_48;
  size_t sStack_40;
  
  pbVar3 = tag->data;
  iVar6 = 0;
  if ((((*pbVar3 & 0x1f) == 9) && ((pbVar3[0xb] & 0xf) == 7)) && (pbVar3[0xc] == 1)) {
    uVar8 = 0;
    if ((((*pbVar3 & 0x1f) == 9) && ((pbVar3[0xb] & 0xf) == 7)) && (pbVar3[0xc] == 1)) {
      uVar8 = (uint)pbVar3[0xf] | (uint)pbVar3[0xe] << 8 | (uint)pbVar3[0xd] << 0x10;
    }
    sei_init(&local_60,
             (double)(((uint)pbVar3[5] << 8 | (uint)pbVar3[7] << 0x18 | (uint)pbVar3[4] << 0x10 |
                      (uint)pbVar3[6]) + uVar8));
    type = flvtag_frametype_keyframe;
    sei_cat(&local_60,sei,1);
    pbVar3 = tag->data;
    uVar8 = 0;
    if ((((*pbVar3 & 0x1f) == 9) && (uVar8 = 0, (pbVar3[0xb] & 0xf) == 7)) && (pbVar3[0xc] == 1)) {
      uVar8 = (uint)pbVar3[0xf] | (uint)pbVar3[0xe] << 8 | (uint)pbVar3[0xd] << 0x10;
    }
    if ((*pbVar3 & 0x1f) == 9) {
      type = (flvtag_frametype_t)(pbVar3[0xb] >> 4);
    }
    flvtag_initavc(&local_78,
                   (uint)pbVar3[5] << 8 | (uint)pbVar3[4] << 0x10 | (uint)pbVar3[7] << 0x18 |
                   (uint)pbVar3[6],uVar8,type);
    puVar4 = tag->data;
    bVar5 = puVar4[1];
    bVar1 = puVar4[2];
    bVar2 = puVar4[3];
    local_68 = tag;
    sVar7 = flvtag_header_size(tag);
    lVar9 = ((ulong)bVar2 | (ulong)((uint)bVar1 << 8 | (uint)bVar5 << 0x10)) - sVar7;
    if (-0xb < lVar9) {
      lVar9 = lVar9 + 0xb;
      sVar7 = flvtag_header_size(local_68);
      puVar10 = (uint *)(puVar4 + sVar7);
      do {
        bVar5 = (byte)puVar10[1] & 0x1f;
        uVar8 = *puVar10;
        uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
        if (bVar5 == 6) {
          sei_cat(&local_60,sei,0);
        }
        else if (((byte)(bVar5 - 10) < 0xfd) && (local_60.head != (sei_message_t *)0x0)) {
          flvtag_avcwritesei(&local_78,&local_60);
          flvtag_avcwritenal(&local_78,(uint8_t *)(puVar10 + 1),(ulong)uVar8);
          sei_free(&local_60);
        }
        else {
          flvtag_avcwritenal(&local_78,(uint8_t *)(puVar10 + 1),(ulong)uVar8);
        }
        puVar10 = (uint *)((long)puVar10 + (ulong)(uVar8 + 4));
        lVar9 = lVar9 - (ulong)(uVar8 + 4);
      } while (0 < lVar9);
    }
    if (local_60.head != (sei_message_t *)0x0) {
      flvtag_avcwritesei(&local_78,&local_60);
      sei_free(&local_60);
    }
    local_48 = local_68->data;
    sStack_40 = local_68->aloc;
    local_68->data = local_78.data;
    local_68->aloc = local_78.aloc;
    if (local_48 != (uint8_t *)0x0) {
      local_78.data = local_48;
      local_78.aloc = sStack_40;
      free(local_48);
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static inline flvtag_type_t flvtag_type(flvtag_t* tag) { return (flvtag_type_t)tag->data[0] & 0x1F; }